

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::draw(XFormWidget *this)

{
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  Axis AVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  allocator_type local_7d;
  undefined4 local_7c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> white;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blue;
  vector<unsigned_char,_std::allocator<unsigned_char>_> green;
  vector<unsigned_char,_std::allocator<unsigned_char>_> red;
  
  if ((this->target).object != (SceneObject *)0x0) {
    green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x400000ff;
    __l._M_len = 4;
    __l._M_array = (iterator)&green;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&red,__l,(allocator_type *)&blue);
    blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x4000ff00;
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&blue;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&green,__l_00,(allocator_type *)&white);
    white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x40ff0000;
    __l_01._M_len = 4;
    __l_01._M_array = (iterator)&white;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&blue,__l_01,(allocator_type *)&local_7c);
    local_7c = 0x40ffffff;
    __l_02._M_len = 4;
    __l_02._M_array = (iterator)&local_7c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&white,__l_02,&local_7d);
    AVar1 = (this->target).axis;
    if (AVar1 == X) {
      red.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[2] = 0x80;
      red.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[1] = 0x80;
      AVar1 = (this->target).axis;
    }
    if (AVar1 == Y) {
      *(undefined1 *)
       (CONCAT44(green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 2) = 0x40;
      *(undefined1 *)
       CONCAT44(green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_) = 0x40;
      *(undefined1 *)
       (CONCAT44(green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 1) = 0xc4;
      AVar1 = (this->target).axis;
    }
    if (AVar1 == Z) {
      *(undefined1 *)
       (CONCAT44(blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 1) = 0x80;
      *(undefined1 *)
       CONCAT44(blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_) = 0x80;
      AVar1 = (this->target).axis;
    }
    if (AVar1 == Center) {
      *(undefined1 *)
       (CONCAT44(white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 2) = 0xc0;
      *(undefined1 *)
       (CONCAT44(white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 1) = 0xc0;
      *(undefined1 *)
       CONCAT44(white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_) = 0xc0;
    }
    this_00 = &this->axisColors;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize(this_00,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&red);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,&green);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,&blue);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3,&white);
    glPushMatrix();
    glDisable(0xb50);
    glDisable(0xb71);
    glEnable(0xbe2);
    glBlendFunc(0x302,0x303);
    drawHandles(this);
    glDisable(0xbe2);
    glEnable(0xb71);
    drawHandles(this);
    glEnable(0xb50);
    glPopMatrix();
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&green.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&red.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void XFormWidget::draw()
{
   if( target.object == nullptr ) return;

   vector<GLubyte>   red = { 255, 0,   0,   64 };
   vector<GLubyte> green = { 0,   255, 0,   64 };
   vector<GLubyte>  blue = { 0,   0,   255, 64 };
   vector<GLubyte> white = { 255, 255, 255, 64 };

   if( target.axis == Selection::Axis::X )      { red[1] = red[2] = 128; }
   if( target.axis == Selection::Axis::Y )      { green[0] = green[2] = 64; green[1] = 196; }
   if( target.axis == Selection::Axis::Z )      { blue[0] = blue[1] = 128; }
   if( target.axis == Selection::Axis::Center ) { white[0] = white[1] = white[2] = 192; }

   axisColors.resize(4);
   axisColors[0] = red;
   axisColors[1] = green;
   axisColors[2] = blue;
   axisColors[3] = white;

   glPushMatrix();
   glDisable( GL_LIGHTING );

   glDisable( GL_DEPTH_TEST );
   glEnable( GL_BLEND );
   glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );
   drawHandles();

   glDisable( GL_BLEND );
   glEnable( GL_DEPTH_TEST );
   drawHandles();
   glEnable( GL_LIGHTING );
   glPopMatrix();
}